

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tweakable.cpp
# Opt level: O1

string * Corrade::Utility::Implementation::findTweakableAlias
                   (string *__return_storage_ptr__,string *data)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  pointer pcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  StringView prefix;
  StringView local_60;
  BasicStringView<const_char> local_50;
  char local_40 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"CORRADE_TWEAKABLE","");
  uVar12 = 0;
LAB_00153569:
  lVar7 = std::__cxx11::string::find((char *)data,0x1657bd,uVar12);
  if (lVar7 != 0) {
    if (lVar7 == -1) {
      return __return_storage_ptr__;
    }
    lVar8 = lVar7;
    do {
      cVar1 = (data->_M_dataplus)._M_p[lVar8 + -1];
      if ((cVar1 != ' ') && (cVar1 != '\t')) {
        uVar12 = lVar7 + 7;
        bVar5 = true;
        if (cVar1 != '\n') goto LAB_0015371c;
        break;
      }
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  uVar12 = lVar7 + 7;
  uVar3 = data->_M_string_length;
  uVar11 = uVar12;
  if (uVar12 < uVar3) {
    uVar10 = uVar12;
    do {
      cVar1 = (data->_M_dataplus)._M_p[uVar10];
      if ((cVar1 != ' ') && (uVar11 = uVar10, cVar1 != '\t')) break;
      uVar10 = uVar10 + 1;
      uVar11 = uVar3;
    } while (uVar3 != uVar10);
  }
  pcVar4 = (data->_M_dataplus)._M_p;
  lVar7 = 0;
  pcVar9 = pcVar4;
  do {
    bVar2 = pcVar9[uVar11];
    if (0x19 < (byte)((bVar2 & 0xdf) + 0xbf)) {
      if ((char)bVar2 < '0') break;
      if ((bVar2 != 0x5f) && (uVar11 - uVar12 == lVar7 || '9' < (char)bVar2)) break;
    }
    lVar7 = lVar7 + -1;
    pcVar9 = pcVar9 + 1;
  } while( true );
  uVar11 = uVar11 - lVar7;
  uVar12 = uVar11;
  for (; (uVar11 < uVar3 &&
         ((cVar1 = pcVar4[uVar11], cVar1 == ' ' || (uVar12 = uVar11, cVar1 == '\t'))));
      uVar11 = uVar11 + 1) {
    uVar12 = uVar3;
  }
  local_60 = Containers::Implementation::
             StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::from(data);
  local_50 = Containers::BasicStringView<const_char>::slice
                       (&local_60,uVar12,local_60._sizePlusFlags & 0x3fffffffffffffff);
  prefix._sizePlusFlags = 0xc000000000000011;
  prefix._data = "CORRADE_TWEAKABLE";
  bVar6 = Containers::BasicStringView<const_char>::hasPrefix(&local_50,prefix);
  bVar5 = true;
  if (bVar6) {
    uVar11 = uVar12 + __return_storage_ptr__->_M_string_length;
    uVar3 = data->_M_string_length;
    uVar12 = uVar11;
    if (uVar11 < uVar3) {
      do {
        cVar1 = (data->_M_dataplus)._M_p[uVar11];
        if ((cVar1 != ' ') && (uVar12 = uVar11, cVar1 != '\t')) break;
        uVar11 = uVar11 + 1;
        uVar12 = uVar3;
      } while (uVar11 < uVar3);
    }
    if (((uVar3 <= uVar12) || (cVar1 = (data->_M_dataplus)._M_p[uVar12], cVar1 == '\r')) ||
       (cVar1 == '\n')) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)data);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
      if (local_50._data != local_40) {
        operator_delete(local_50._data);
      }
      bVar5 = false;
    }
  }
LAB_0015371c:
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  goto LAB_00153569;
}

Assistant:

std::string findTweakableAlias(const std::string& data) {
    using namespace Containers::Literals;

    std::string name = "CORRADE_TWEAKABLE";
    std::size_t pos = 0;
    while((pos = data.find("#define", pos)) != std::string::npos) {
        /* Eat all whitespace before */
        std::size_t prev = pos;
        while(prev && (data[prev - 1] == ' ' || data[prev - 1] == '\t'))
            --prev;

        /* Skip what we found, so `continue`s will not cause an infinite loop */
        pos += 7;

        /* If this is not at the start of a line (or first in the file), nope */
        if(prev && data[prev - 1] != '\n')
            continue;

        /* Get rid of whitespace */
        std::size_t beg = pos;
        eatWhitespace(data, beg);

        /* Consume the name */
        std::size_t end = beg;
        while((data[end] >= 'A' && data[end] <= 'Z') ||
              (data[end] >= 'a' && data[end] <= 'z') ||
              (data[end] >= '0' && data[end] <= '9' && end != pos) ||
              (data[end] == '_')) ++end;

        /* Get rid of whitespace after */
        pos = end;
        eatWhitespace(data, pos);

        /* If the rest doesn't read CORRADE_TWEAKABLE, nope */
        /** @todo convert all this to operate on StringViews when we have
            find() as well */
        if(!Containers::StringView{data}.exceptPrefix(pos).hasPrefix("CORRADE_TWEAKABLE"_s))
            continue;

        /* Get rid of whitespace at the end of the line */
        pos += name.size();
        eatWhitespace(data, pos);

        /* If there is something else than a newline or EOF, nope */
        if(pos < data.size() && data[pos] != '\r' && data[pos] != '\n')
            continue;

        /* Save the name */
        name = data.substr(beg, end - beg);
        break;
    }

    return name;
}